

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmAbc.c
# Opt level: O2

int Mpm_ManNodeIfToGia_rec
              (Gia_Man_t *pNew,Mpm_Man_t *pMan,Mig_Obj_t *pObj,Vec_Ptr_t *vVisited,int fHash)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Mpm_Cut_t *Entry;
  Mig_Obj_t *p;
  Mig_Obj_t *pMVar5;
  int iData0;
  
  if (fHash != 0) {
    __assert_fail("fHash == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/mpm/mpmAbc.c"
                  ,0x82,
                  "int Mpm_ManNodeIfToGia_rec(Gia_Man_t *, Mpm_Man_t *, Mig_Obj_t *, Vec_Ptr_t *, int)"
                 );
  }
  Entry = Mpm_ObjCutBestP(pMan,pObj);
  iVar1 = Entry->hNext;
  if (iVar1 == 0) {
    Vec_PtrPush(vVisited,Entry);
    Entry->hNext = -1;
    iVar1 = Mig_ObjIsCi(pObj);
    if (iVar1 == 0) {
      iVar1 = 0;
      pMVar5 = pObj;
      while (p = pMVar5, p != (Mig_Obj_t *)0x0) {
        pMVar5 = Mig_ObjFanin0(p);
        iVar2 = Mpm_ManNodeIfToGia_rec(pNew,pMan,pMVar5,vVisited,0);
        if (iVar2 != -1) {
          if ((uint)p->pFans[1] < 0xfffffffe) {
            pMVar5 = Mig_ObjFanin(p,1);
          }
          else {
            pMVar5 = (Mig_Obj_t *)0x0;
          }
          iVar3 = Mpm_ManNodeIfToGia_rec(pNew,pMan,pMVar5,vVisited,0);
          if (iVar3 != -1) {
            if (((uint)p->pFans[1] < 0xfffffffe) && ((uint)p->pFans[2] < 0xfffffffe)) {
              pMVar5 = Mig_ObjFanin(p,2);
              iVar4 = Mpm_ManNodeIfToGia_rec(pNew,pMan,pMVar5,vVisited,0);
              iVar1 = -1;
              if (iVar4 == -1) goto LAB_0070140c;
              iVar1 = Abc_LitNotCond(iVar4,(uint)p->pFans[2] & 1);
            }
            iVar2 = Abc_LitNotCond(iVar2,(uint)p->pFans[0] & 1);
            iVar3 = Abc_LitNotCond(iVar3,(uint)p->pFans[1] & 1);
            if ((uint)p->pFans[1] < 0xfffffffe) {
              iVar4 = iVar3;
              iData0 = iVar2;
              if (0xfffffffd < (uint)p->pFans[2]) {
                if ((uint)p->pFans[0] >> 1 <= (uint)p->pFans[1] >> 1) goto LAB_00701498;
                iVar4 = Abc_LitNot(iVar3);
                iData0 = iVar3;
                iVar1 = iVar2;
              }
              iVar1 = Gia_ManAppendMux(pNew,iVar1,iVar4,iData0);
            }
            else {
LAB_00701498:
              iVar1 = Gia_ManAppendAnd(pNew,iVar2,iVar3);
            }
            if ((((uint)pObj->pFans[3] ^ (uint)p->pFans[3]) & 1) != 0) {
              iVar1 = Abc_LitNot(iVar1);
            }
            Entry->hNext = iVar1;
            return iVar1;
          }
        }
LAB_0070140c:
        iVar2 = Mig_ObjSiblId(p);
        pMVar5 = (Mig_Obj_t *)0x0;
        if (iVar2 != 0) {
          iVar2 = Mig_ObjSiblId(p);
          pMVar5 = Mig_ManObj(*(Mig_Man_t **)
                               ((long)p + (-0x10 - (ulong)(((uint)p->pFans[3] & 0x1ffe) << 3))),
                              iVar2);
        }
      }
      iVar1 = Entry->hNext;
    }
    else {
      iVar1 = -1;
    }
  }
  return iVar1;
}

Assistant:

int Mpm_ManNodeIfToGia_rec( Gia_Man_t * pNew, Mpm_Man_t * pMan, Mig_Obj_t * pObj, Vec_Ptr_t * vVisited, int fHash )
{
    Mig_Obj_t * pTemp;
    Mpm_Cut_t * pCut;
    int iFunc, iFunc0, iFunc1, iFunc2 = 0;
    assert( fHash == 0 );
    // get the best cut
    pCut = Mpm_ObjCutBestP( pMan, pObj );
    // if the cut is visited, return the result
    if ( Mpm_CutDataInt(pCut) )
        return Mpm_CutDataInt(pCut);
    // mark the node as visited
    Vec_PtrPush( vVisited, pCut );
    // insert the worst case
    Mpm_CutSetDataInt( pCut, ~0 );
    // skip in case of primary input
    if ( Mig_ObjIsCi(pObj) )
        return Mpm_CutDataInt(pCut);
    // compute the functions of the children
    for ( pTemp = pObj; pTemp; pTemp = Mig_ObjSibl(pTemp) )
    {
        iFunc0 = Mpm_ManNodeIfToGia_rec( pNew, pMan, Mig_ObjFanin0(pTemp), vVisited, fHash );
        if ( iFunc0 == ~0 )
            continue;
        iFunc1 = Mpm_ManNodeIfToGia_rec( pNew, pMan, Mig_ObjFanin1(pTemp), vVisited, fHash );
        if ( iFunc1 == ~0 )
            continue;
        if ( Mig_ObjIsNode3(pTemp) )
        {
            iFunc2 = Mpm_ManNodeIfToGia_rec( pNew, pMan, Mig_ObjFanin2(pTemp), vVisited, fHash );
            if ( iFunc2 == ~0 )
                continue;
            iFunc2 = Abc_LitNotCond(iFunc2, Mig_ObjFaninC2(pTemp));
        }
        iFunc0 = Abc_LitNotCond(iFunc0, Mig_ObjFaninC0(pTemp));
        iFunc1 = Abc_LitNotCond(iFunc1, Mig_ObjFaninC1(pTemp));
        // both branches are solved
        if ( fHash )
        {
            if ( Mig_ObjIsMux(pTemp) )
                iFunc = Gia_ManHashMux( pNew, iFunc2, iFunc1, iFunc0 );
            else if ( Mig_ObjIsXor(pTemp) )
                iFunc = Gia_ManHashXor( pNew, iFunc0, iFunc1 );
            else 
                iFunc = Gia_ManHashAnd( pNew, iFunc0, iFunc1 ); 
        }
        else
        {
            if ( Mig_ObjIsMux(pTemp) )
                iFunc = Gia_ManAppendMux( pNew, iFunc2, iFunc1, iFunc0 );
            else if ( Mig_ObjIsXor(pTemp) )
                iFunc = Gia_ManAppendXor( pNew, iFunc0, iFunc1 );
            else 
                iFunc = Gia_ManAppendAnd( pNew, iFunc0, iFunc1 ); 
        }
        if ( Mig_ObjPhase(pTemp) != Mig_ObjPhase(pObj) )
            iFunc = Abc_LitNot(iFunc);
        Mpm_CutSetDataInt( pCut, iFunc );
        break;
    }
    return Mpm_CutDataInt(pCut);
}